

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

void __thiscall ONX_ModelPrivate::ONX_ModelPrivate(ONX_ModelPrivate *this,ONX_Model *m)

{
  Type TVar1;
  int iVar2;
  ONX_ModelComponentList *pOVar3;
  uint i;
  uint component_type_as_unsigned;
  
  this->m_model = m;
  this->m_model_content_version_number = 0;
  (this->m_mcr_lists)._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_008217c0;
  (this->m_mcr_lists).m_a = (ONX_ModelComponentList *)0x0;
  (this->m_mcr_lists).m_count = 0;
  (this->m_mcr_lists).m_capacity = 0;
  iVar2 = ON_ComponentManifestImpl_TableCount();
  ON_REMOVE_ASAP_AssertEx
            ((uint)(iVar2 == 0x12),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,0x131f,"",
             "int(ON_ModelComponent::Type::NumOf) == ON_ComponentManifestImpl_TableCount() is false"
            );
  for (component_type_as_unsigned = 0; component_type_as_unsigned != 0x12;
      component_type_as_unsigned = component_type_as_unsigned + 1) {
    pOVar3 = ON_ClassArray<ONX_Model::ONX_ModelComponentList>::AppendNew(&this->m_mcr_lists);
    TVar1 = ON_ModelComponent::ComponentTypeFromUnsigned(component_type_as_unsigned);
    pOVar3->m_component_type = TVar1;
  }
  return;
}

Assistant:

ONX_ModelPrivate::ONX_ModelPrivate(ONX_Model& m)
  :
  m_model(m)
{
  // The TableCount enum in opennurbs_archive_manifest.cpp should always be
  // equal to ON_ModelComponent::Type::NumOf.
  ON_ASSERT(int(ON_ModelComponent::Type::NumOf) == ON_ComponentManifestImpl_TableCount());

  for (unsigned int i = 0; i < int(ON_ModelComponent::Type::NumOf); i++)
  {
    ONX_Model::ONX_ModelComponentList& list = m_mcr_lists.AppendNew();
    list.m_component_type = ON_ModelComponent::ComponentTypeFromUnsigned(i);
  }
}